

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

AdsHandle * __thiscall
AdsDevice::GetHandle
          (AdsHandle *__return_storage_ptr__,AdsDevice *this,uint32_t indexGroup,
          uint32_t indexOffset,AdsNotificationAttrib *notificationAttributes,
          PAdsNotificationFuncEx callback,uint32_t hUser)

{
  type plVar1;
  AdsException *this_00;
  pointer __p;
  AdsDevice *local_c0;
  code *local_b8;
  undefined8 local_b0;
  type local_a8;
  function<long_(unsigned_int)> local_90;
  ResourceDeleter<unsigned_int> local_70;
  long local_40;
  long error;
  PAdsNotificationFuncEx p_Stack_30;
  uint32_t handle;
  PAdsNotificationFuncEx callback_local;
  AdsNotificationAttrib *notificationAttributes_local;
  uint32_t indexOffset_local;
  uint32_t indexGroup_local;
  AdsDevice *this_local;
  
  error._4_4_ = 0;
  p_Stack_30 = callback;
  callback_local = (PAdsNotificationFuncEx)notificationAttributes;
  notificationAttributes_local._0_4_ = indexOffset;
  notificationAttributes_local._4_4_ = indexGroup;
  _indexOffset_local = this;
  this_local = (AdsDevice *)__return_storage_ptr__;
  plVar1 = std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::operator*(&this->m_LocalPort);
  local_40 = AdsSyncAddDeviceNotificationReqEx
                       (*plVar1,&this->m_Addr,notificationAttributes_local._4_4_,
                        (uint32_t)notificationAttributes_local,
                        (AdsNotificationAttrib *)callback_local,p_Stack_30,hUser,
                        (uint32_t *)((long)&error + 4));
  if ((local_40 == 0) && (error._4_4_ != 0)) {
    error._4_4_ = bhf::ads::letoh<unsigned_int>((uint *)((long)&error + 4));
    __p = (pointer)operator_new(4);
    *__p = error._4_4_;
    local_b8 = DeleteNotificationHandle;
    local_b0 = 0;
    local_c0 = this;
    std::bind<long(AdsDevice::*)(unsigned_int)const,AdsDevice_const*,std::_Placeholder<1>const&>
              (&local_a8,(offset_in_AdsDevice_to_subr *)&local_b8,&local_c0,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<long(unsigned_int)>::
    function<std::_Bind<long(AdsDevice::*(AdsDevice_const*,std::_Placeholder<1>))(unsigned_int)const>,void>
              ((function<long(unsigned_int)> *)&local_90,&local_a8);
    ResourceDeleter<unsigned_int>::ResourceDeleter(&local_70,&local_90);
    std::unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>>::
    unique_ptr<ResourceDeleter<unsigned_int>,void>
              ((unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>> *)__return_storage_ptr__,__p,
               &local_70);
    ResourceDeleter<unsigned_int>::~ResourceDeleter(&local_70);
    std::function<long_(unsigned_int)>::~function(&local_90);
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,local_40);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::GetHandle(const uint32_t               indexGroup,
                               const uint32_t               indexOffset,
                               const AdsNotificationAttrib& notificationAttributes,
                               PAdsNotificationFuncEx       callback,
                               const uint32_t               hUser) const
{
    uint32_t handle = 0;
    auto error = AdsSyncAddDeviceNotificationReqEx(
        *m_LocalPort, &m_Addr,
        indexGroup, indexOffset,
        &notificationAttributes,
        callback,
        hUser,
        &handle);
    if (error || !handle) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::DeleteNotificationHandle, this, std::placeholders::_1)}};
}